

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelocDirWrapper.cpp
# Opt level: O1

QString * RelocEntryWrapper::translateType(QString *__return_storage_ptr__,WORD type)

{
  undefined6 in_register_00000032;
  storage_type *psVar1;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  Data *local_30;
  char16_t *local_28;
  qsizetype local_20;
  
  switch(CONCAT62(in_register_00000032,type) & 0xffffffff) {
  case 0:
    psVar1 = (storage_type *)0x11;
    break;
  case 1:
    goto LAB_00137d4b;
  case 2:
LAB_00137d4b:
    psVar1 = (storage_type *)0x19;
    break;
  case 3:
    goto LAB_00137da8;
  case 4:
    psVar1 = (storage_type *)0x7;
    break;
  case 5:
    psVar1 = (storage_type *)0xd;
    break;
  case 6:
  case 7:
    psVar1 = (storage_type *)0x8;
    break;
  default:
    QVar2.m_data = (storage_type *)0x0;
    QVar2.m_size = (qsizetype)&local_30;
    QString::fromUtf8(QVar2);
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = local_30;
    goto LAB_00137de2;
  case 9:
    psVar1 = (storage_type *)0xf;
    break;
  case 10:
LAB_00137da8:
    psVar1 = (storage_type *)0xc;
  }
  QVar3.m_data = psVar1;
  QVar3.m_size = (qsizetype)&local_30;
  QString::fromUtf8(QVar3);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = local_30;
LAB_00137de2:
  (__return_storage_ptr__->d).ptr = local_28;
  (__return_storage_ptr__->d).size = local_20;
  return __return_storage_ptr__;
}

Assistant:

QString RelocEntryWrapper::translateType(WORD type)
{
    switch (type) {
        case 0 : return "Padding (skipped)";
        case 1 : return "High WORD of 32-bit field";
        case 2 : return "Low  WORD of 32-bit field";
        case 3 : return "32 bit field";
        case 4 : return "HighAdj";
        case 5 : return "MIPS JumpAddr";
        case 6 : case 7 : return "Reserved";
        case 9 : return "MIPS16 JumpAddr";
        case 10 : return "64 bit field";
    }
    return "";
}